

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O3

ValueInfo * __thiscall
GlobOpt::UpdateIntBoundsForEqual
          (GlobOpt *this,Value *value,IntConstantBounds *constantBounds,Value *boundValue,
          IntConstantBounds *boundConstantBounds,bool isExplicit)

{
  ValueNumber myValueNumber;
  code *pcVar1;
  int32 min;
  bool bVar2;
  undefined4 *puVar3;
  IntBounds *this_00;
  IntBoundedValueInfo *pIVar4;
  ValueInfo *pVVar5;
  int max;
  
  if (value == (Value *)0x0) {
    if (constantBounds->lowerBound != constantBounds->upperBound) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x1a1,"(value || constantBounds.IsConstant())",
                         "value || constantBounds.IsConstant()");
      if (!bVar2) goto LAB_004a1f94;
      *puVar3 = 0;
    }
    if (boundValue != (Value *)0x0) {
      return (ValueInfo *)0x0;
    }
  }
  else if (boundValue != (Value *)0x0) {
    if (value->valueNumber == boundValue->valueNumber) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x1a7,
                         "(!boundValue || value->GetValueNumber() != boundValue->GetValueNumber())",
                         "!boundValue || value->GetValueNumber() != boundValue->GetValueNumber()");
      if (!bVar2) goto LAB_004a1f94;
      *puVar3 = 0;
      bVar2 = false;
    }
    else {
      bVar2 = false;
    }
    goto LAB_004a1e6f;
  }
  if (boundConstantBounds->lowerBound != boundConstantBounds->upperBound) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x1a2,"(boundValue || boundConstantBounds.IsConstant())",
                       "boundValue || boundConstantBounds.IsConstant()");
    if (!bVar2) {
LAB_004a1f94:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = true;
  if (value == (Value *)0x0) {
    return (ValueInfo *)0x0;
  }
LAB_004a1e6f:
  pVVar5 = value->valueInfo;
  this_00 = GetIntBoundsToUpdate
                      (this,pVVar5,constantBounds,true,
                       boundConstantBounds->lowerBound == boundConstantBounds->upperBound,true,
                       isExplicit);
  if (this_00 != (IntBounds *)0x0) {
    if (bVar2) {
      IntBounds::SetLowerBound(this_00,boundConstantBounds->lowerBound);
      IntBounds::SetUpperBound(this_00,boundConstantBounds->lowerBound,isExplicit);
    }
    else {
      myValueNumber = value->valueNumber;
      IntBounds::SetLowerBound(this_00,myValueNumber,boundValue,isExplicit);
      IntBounds::SetUpperBound(this_00,myValueNumber,boundValue,isExplicit);
    }
    bVar2 = IntBounds::RequiresIntBoundedValueInfo
                      (this_00,(ValueType)
                               *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                                &(pVVar5->super_ValueType).field_0.field_0);
    if (bVar2) {
      pIVar4 = NewIntBoundedValueInfo(this,pVVar5,this_00);
      return &pIVar4->super_ValueInfo;
    }
    IntBounds::Delete(this_00);
  }
  bVar2 = ValueType::IsInt(&pVVar5->super_ValueType);
  if (bVar2) {
    min = boundConstantBounds->lowerBound;
    if (boundConstantBounds->lowerBound < constantBounds->lowerBound) {
      min = constantBounds->lowerBound;
    }
    max = boundConstantBounds->upperBound;
    if (constantBounds->upperBound < boundConstantBounds->upperBound) {
      max = constantBounds->upperBound;
    }
    if (min <= max) {
      pVVar5 = NewIntRangeValueInfo(this,pVVar5,min,max);
      return pVVar5;
    }
  }
  return (ValueInfo *)0x0;
}

Assistant:

ValueInfo *GlobOpt::UpdateIntBoundsForEqual(
    Value *const value,
    const IntConstantBounds &constantBounds,
    Value *const boundValue,
    const IntConstantBounds &boundConstantBounds,
    const bool isExplicit)
{
    Assert(value || constantBounds.IsConstant());
    Assert(boundValue || boundConstantBounds.IsConstant());
    if(!value)
    {
        return nullptr;
    }
    Assert(!boundValue || value->GetValueNumber() != boundValue->GetValueNumber());

    ValueInfo *const valueInfo = value->GetValueInfo();
    IntBounds *const bounds =
        GetIntBoundsToUpdate(valueInfo, constantBounds, true, boundConstantBounds.IsConstant(), true, isExplicit);
    if(bounds)
    {
        if(boundValue)
        {
            const ValueNumber valueNumber = value->GetValueNumber();
            bounds->SetLowerBound(valueNumber, boundValue, isExplicit);
            bounds->SetUpperBound(valueNumber, boundValue, isExplicit);
        }
        else
        {
            bounds->SetLowerBound(boundConstantBounds.LowerBound());
            bounds->SetUpperBound(boundConstantBounds.LowerBound(), isExplicit);
        }
        if(bounds->RequiresIntBoundedValueInfo(valueInfo->Type()))
        {
            return NewIntBoundedValueInfo(valueInfo, bounds);
        }
        bounds->Delete();
    }

    if(!valueInfo->IsInt())
    {
        return nullptr;
    }

    const int32 newMin = max(constantBounds.LowerBound(), boundConstantBounds.LowerBound());
    const int32 newMax = min(constantBounds.UpperBound(), boundConstantBounds.UpperBound());
    return newMin <= newMax ? NewIntRangeValueInfo(valueInfo, newMin, newMax) : nullptr;
}